

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ManComputeBackward1(Of_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  Jf_Par_t *pJVar4;
  Gia_Obj_t *pGVar5;
  undefined8 uVar6;
  Of_Obj_t *pOVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint *puVar18;
  uint *puVar19;
  ulong uVar20;
  
  iVar2 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,1);
  pJVar4 = p->pPars;
  pJVar4->Area = 0;
  pJVar4->Edge = 0;
  lVar11 = (long)p->pGia->nObjs;
  if (1 < lVar11) {
    pGVar5 = p->pGia->pObjs;
    do {
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        return;
      }
      lVar12 = lVar11 + -1;
      uVar6 = *(undefined8 *)(pGVar5 + lVar12);
      uVar17 = (uint)uVar6;
      if ((~uVar17 & 0x1fffffff) != 0 && -1 < (int)uVar17) {
        pOVar7 = p->pObjs;
        iVar16 = pOVar7[lVar12].Required;
        if ((((int)uVar17 < 0) || ((uVar17 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar17 & 0x1fffffff) != ((uint)((ulong)uVar6 >> 0x20) & 0x1fffffff))) {
          if (pOVar7[lVar12].nRefs != 0) {
            if ((p->vCutSets).nSize < lVar11) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar17 = (p->vCutSets).pArray[lVar12];
            uVar9 = (int)uVar17 >> 0x10;
            if (((int)uVar9 < 0) || ((p->vPages).nSize <= (int)uVar9)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            puVar1 = (uint *)((long)(p->vPages).pArray[uVar9] + ((ulong)uVar17 & 0xffff) * 4);
            if ((int)*puVar1 < 1) {
              puVar18 = (uint *)0x0;
            }
            else {
              puVar19 = puVar1 + 1;
              iVar14 = 1000000000;
              uVar9 = 0;
              puVar18 = (uint *)0x0;
              do {
                uVar15 = (ulong)(*puVar19 & 0x1f);
                if ((int)puVar19[uVar15 + 1] <= iVar16) {
                  if ((*puVar19 & 0x1f) == 0) {
                    iVar13 = 0;
                  }
                  else {
                    uVar20 = 0;
                    iVar13 = 0;
                    do {
                      uVar3 = puVar19[uVar20 + 1];
                      if ((int)uVar3 < 0) goto LAB_00738569;
                      if (uVar3 < 2) break;
                      if (pOVar7[uVar3 >> 1].nRefs == 0) {
                        iVar13 = iVar13 + pOVar7[uVar3 >> 1].Flow;
                      }
                      uVar20 = uVar20 + 1;
                    } while (uVar15 != uVar20);
                  }
                  if (iVar13 < iVar14) {
                    puVar18 = puVar19;
                  }
                  if (iVar13 <= iVar14) {
                    iVar14 = iVar13;
                  }
                }
                uVar9 = uVar9 + 1;
                puVar19 = puVar19 + uVar15 + 4;
              } while (uVar9 != *puVar1);
            }
            if (puVar18 == (uint *)0x0) {
              __assert_fail("pCutMin != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                            ,0x4b2,"void Of_ManComputeBackward1(Of_Man_t *)");
            }
            if (puVar18 < puVar1 || (long)puVar18 - (long)puVar1 == 0) {
              __assert_fail("pCut > pCutSet",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                            ,0x6c,"int Of_CutHandle(int *, int *)");
            }
            pOVar7[lVar12].iCutH = (int)((ulong)((long)puVar18 - (long)puVar1) >> 2) + uVar17;
            uVar15 = (ulong)(*puVar18 & 0x1f);
            if ((*puVar18 & 0x1f) != 0) {
              iVar16 = iVar16 - iVar2;
              uVar20 = 0;
              do {
                uVar17 = puVar18[uVar20 + 1];
                if ((int)uVar17 < 0) {
LAB_00738569:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf2,"int Abc_Lit2Var(int)");
                }
                if (uVar17 < 2) break;
                uVar17 = uVar17 >> 1;
                if (iVar16 < pOVar7[uVar17].Required) {
                  pOVar7[uVar17].Required = iVar16;
                }
                pOVar7[uVar17].nRefs = pOVar7[uVar17].nRefs + 1;
                uVar20 = uVar20 + 1;
                uVar15 = (ulong)(*puVar18 & 0x1f);
              } while (uVar20 < uVar15);
            }
            pJVar4->Edge = pJVar4->Edge + uVar15;
            pJVar4->Area = pJVar4->Area + 1;
          }
        }
        else {
          lVar10 = lVar12 - (ulong)(uVar17 & 0x1fffffff);
          if (iVar16 < pOVar7[lVar10].Required) {
            pOVar7[lVar10].Required = iVar16;
          }
          pOVar7[lVar10].nRefs = pOVar7[lVar10].nRefs + 1;
        }
      }
      bVar8 = 2 < lVar11;
      lVar11 = lVar12;
    } while (bVar8);
  }
  return;
}

Assistant:

void Of_ManComputeBackward1( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pList, * pCut, * pCutMin;
    Of_ManComputeOutputRequired( p, 1 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int CostMin, Cost, Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            Of_ObjRefInc( p, FaninId );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // select the best cut
        pCutMin = NULL;
        CostMin = ABC_INFINITY;
        pList = Of_ObjCutSet( p, i );
        Of_SetForEachCut( pList, pCut, k )
        {
            if ( Of_CutDelay1(pCut) > Required )
                continue;
            Cost = Of_ManComputeBackwardCut( p, pCut );
            if ( CostMin > Cost )
            {
                CostMin = Cost;
                pCutMin = pCut;
            }
        }
        // the cut is selected
        assert( pCutMin != NULL );
        Of_ObjSetCutBestP( p, pList, i, pCutMin );
        Of_CutForEachVar( pCutMin, iVar, k )
        {
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
            Of_ObjRefInc( p, iVar );
        }
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}